

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_addapply(CHAR_DATA *ch,char *argument)

{
  AFFECT_DATA *pAVar1;
  AFFECT_DATA *af_00;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  OBJ_DATA *obj;
  OBJ_APPLY_DATA *pOVar5;
  short sVar6;
  AFFECT_DATA af;
  char arg2 [4608];
  char arg3 [4608];
  char arg1 [4608];
  AFFECT_DATA local_3690;
  char local_3628 [4608];
  char local_2428 [4608];
  char local_1228 [4616];
  
  pcVar4 = one_argument(argument,local_1228);
  pcVar4 = one_argument(pcVar4,local_3628);
  one_argument(pcVar4,local_2428);
  if ((local_1228[0] == '\0') || (local_3628[0] == '\0')) {
    send_to_char("Syntax for applies: addapply <object> <apply type> <value>\n\r",ch);
    send_to_char("                    addapply <object> clear\n\r",ch);
    send_to_char("Apply Types: hp str dex int wis con mana\n\r",ch);
    send_to_char("             ac move hitroll damroll saves\n\r\n\r",ch);
    send_to_char("Syntax for affects: addapply <object> affect <affect name>\n\r",ch);
    send_to_char("Affect Names: blind invisible detect_evil detect_invis detect_magic\n\r",ch);
    send_to_char("              detect_hidden detect_good sanctuary infrared\n\r",ch);
    send_to_char("              curse poison protect_evil protect_good sneak hide sleep charm\n\r",
                 ch);
    send_to_char("              flying pass_door haste calm plague weaken dark_vision berserk\n\r",
                 ch);
    pcVar4 = "              waterbreath regeneration slow\n\r";
    goto LAB_00276342;
  }
  obj = get_obj_world(ch,local_1228);
  if (obj == (OBJ_DATA *)0x0) {
    pcVar4 = "No such object exists!\n\r";
    goto LAB_00276342;
  }
  bVar2 = str_prefix(local_3628,"clear");
  if (!bVar2) {
    af_00 = obj->charaffs;
    while (af_00 != (AFFECT_DATA *)0x0) {
      pAVar1 = af_00->next;
      free_affect(af_00);
      af_00 = pAVar1;
    }
    obj->charaffs = (AFFECT_DATA *)0x0;
    obj->apply = (OBJ_APPLY_DATA *)0x0;
    act("All affects removed from $p.",ch,obj,(void *)0x0,3);
    return;
  }
  if (local_2428[0] == '\0') {
    return;
  }
  bVar2 = str_prefix(local_3628,"hp");
  if (bVar2) {
    bVar2 = str_prefix(local_3628,"str");
    if (!bVar2) {
      sVar6 = 1;
      goto LAB_0027628c;
    }
    bVar2 = str_prefix(local_3628,"dex");
    if (!bVar2) {
      sVar6 = 2;
      goto LAB_0027628c;
    }
    bVar2 = str_prefix(local_3628,"int");
    if (!bVar2) {
      sVar6 = 3;
      goto LAB_0027628c;
    }
    bVar2 = str_prefix(local_3628,"wis");
    if (!bVar2) {
      sVar6 = 4;
      goto LAB_0027628c;
    }
    bVar2 = str_prefix(local_3628,"con");
    if (!bVar2) {
      sVar6 = 5;
      goto LAB_0027628c;
    }
    bVar2 = str_prefix(local_3628,"mana");
    if (!bVar2) {
      sVar6 = 0xc;
      goto LAB_0027628c;
    }
    bVar2 = str_prefix(local_3628,"move");
    if (!bVar2) {
      sVar6 = 0xe;
      goto LAB_0027628c;
    }
    bVar2 = str_prefix(local_3628,"ac");
    if (!bVar2) {
      sVar6 = 0x11;
      goto LAB_0027628c;
    }
    bVar2 = str_prefix(local_3628,"hitroll");
    if (!bVar2) {
      sVar6 = 0x12;
      goto LAB_0027628c;
    }
    bVar2 = str_prefix(local_3628,"damroll");
    if (!bVar2) {
      sVar6 = 0x13;
      goto LAB_0027628c;
    }
    bVar2 = str_prefix(local_3628,"saves");
    if (!bVar2) {
      sVar6 = 0x19;
      goto LAB_0027628c;
    }
    bVar2 = str_prefix(local_3628,"affect");
    if (bVar2) {
      pcVar4 = "That apply is not possible!\n\r";
      goto LAB_00276342;
    }
    sVar6 = 0x1a;
    bVar2 = true;
  }
  else {
    sVar6 = 0xd;
LAB_0027628c:
    bVar2 = false;
  }
  if (bVar2) {
    init_affect(&local_3690);
    local_3690.where = 0;
    iVar3 = skill_lookup(local_2428);
    local_3690.type = (short)iVar3;
    if (local_3690.type == -1) {
      pcVar4 = "Invalid affect.\n\r";
      goto LAB_00276342;
    }
    local_3690.level = obj->level;
    local_3690.duration = -1;
    local_3690.location = 0;
    local_3690.modifier = 0;
    local_3690.owner = (CHAR_DATA *)0x0;
    charaff_to_obj(obj,&local_3690);
  }
  else {
    pOVar5 = new_apply_data();
    pOVar5->location = sVar6;
    bVar2 = is_number(local_2428);
    if (!bVar2) {
      pcVar4 = "Applies require a numerical value.\n\r";
      goto LAB_00276342;
    }
    iVar3 = atoi(local_2428);
    pOVar5->modifier = (short)iVar3;
    pOVar5->next = obj->apply;
    obj->apply = pOVar5;
  }
  pcVar4 = "Ok.\n\r";
LAB_00276342:
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_addapply(CHAR_DATA *ch, char *argument)
{
	OBJ_DATA *obj;
	AFFECT_DATA *paf, *paf_next, af;
	OBJ_APPLY_DATA *app, *app_next;
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	int modifier, location;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	argument = one_argument(argument, arg3);

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		send_to_char("Syntax for applies: addapply <object> <apply type> <value>\n\r", ch);
		send_to_char("                    addapply <object> clear\n\r", ch);
		send_to_char("Apply Types: hp str dex int wis con mana\n\r", ch);
		send_to_char("             ac move hitroll damroll saves\n\r\n\r", ch);
		send_to_char("Syntax for affects: addapply <object> affect <affect name>\n\r", ch);
		send_to_char("Affect Names: blind invisible detect_evil detect_invis detect_magic\n\r", ch);
		send_to_char("              detect_hidden detect_good sanctuary infrared\n\r", ch);
		send_to_char("              curse poison protect_evil protect_good sneak hide sleep charm\n\r", ch);
		send_to_char("              flying pass_door haste calm plague weaken dark_vision berserk\n\r", ch);
		send_to_char("              waterbreath regeneration slow\n\r", ch);
		return;
	}

	obj = get_obj_world(ch, arg1);
	if (obj == nullptr)
	{
		send_to_char("No such object exists!\n\r", ch);
		return;
	}

	if (!str_prefix(arg2, "clear"))
	{
		for (paf = obj->charaffs; paf; paf = paf_next)
		{
			paf_next = paf->next;
			free_affect(paf);
		}

		obj->charaffs = nullptr;

		for (app = obj->apply; app; app = app_next)
		{
			app_next = app->next;
		}

		obj->apply = nullptr;

		act("All affects removed from $p.", ch, obj, 0, TO_CHAR);
		return;
	}

	if (arg3[0] == '\0')
		return;

	if (!str_prefix(arg2, "hp"))
		location = APPLY_HIT;
	else if (!str_prefix(arg2, "str"))
		location = APPLY_STR;
	else if (!str_prefix(arg2, "dex"))
		location = APPLY_DEX;
	else if (!str_prefix(arg2, "int"))
		location = APPLY_INT;
	else if (!str_prefix(arg2, "wis"))
		location = APPLY_WIS;
	else if (!str_prefix(arg2, "con"))
		location = APPLY_CON;
	else if (!str_prefix(arg2, "mana"))
		location = APPLY_MANA;
	else if (!str_prefix(arg2, "move"))
		location = APPLY_MOVE;
	else if (!str_prefix(arg2, "ac"))
		location = APPLY_AC;
	else if (!str_prefix(arg2, "hitroll"))
		location = APPLY_HITROLL;
	else if (!str_prefix(arg2, "damroll"))
		location = APPLY_DAMROLL;
	else if (!str_prefix(arg2, "saves"))
		location = APPLY_SAVING_SPELL;
	else if (!str_prefix(arg2, "affect"))
		location = APPLY_SPELL_AFFECT;
	else
	{
		send_to_char("That apply is not possible!\n\r", ch);
		return;
	}

	if (location != APPLY_SPELL_AFFECT)
	{
		app = new_apply_data();
		app->location = location;

		if (is_number(arg3))
		{
			modifier = atoi(arg3);
		}
		else
		{
			send_to_char("Applies require a numerical value.\n\r", ch);
			return;
		}

		app->modifier = modifier;
		app->next = obj->apply;
		obj->apply = app;
	}
	else
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = skill_lookup(arg3);

		if (af.type == -1)
		{
			send_to_char("Invalid affect.\n\r", ch);
			return;
		}

		af.level = obj->level;
		af.duration = -1;
		af.location = 0;
		af.modifier = 0;
		af.owner = nullptr;
		charaff_to_obj(obj, &af);
	}

	send_to_char("Ok.\n\r", ch);
}